

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall xemmai::t_parser::operator()(t_parser *this,t_scope *a_scope)

{
  t_object *ptVar1;
  t_object *ptVar2;
  set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
  *psVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  wchar_t *pwVar6;
  pointer *__ptr;
  t_scope *ptVar7;
  iterator __begin1;
  t_object *ptVar8;
  wstring_view a_message;
  t_object *symbol;
  _Alloc_hider local_40;
  pointer local_38;
  t_variable *p;
  
  this->v_scope = a_scope;
  pwVar6 = (this->v_lexer).v_indent.v_i;
  ptVar8 = (this->v_lexer).v_indent.v_p;
  while( true ) {
    ptVar7 = this->v_scope;
    if ((this->v_lexer).v_token == c_token__EOF) {
      psVar3 = &ptVar7->v_unresolveds;
      for (p_Var5 = (ptVar7->v_unresolveds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        symbol = *(t_object **)(p_Var5 + 1);
        iVar4 = std::
                _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>,_std::_Select1st<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
                ::find(&(ptVar7->v_variables)._M_t,&symbol);
        ptVar7 = this->v_scope;
        if ((_Rb_tree_header *)iVar4._M_node !=
            &(ptVar7->v_variables)._M_t._M_impl.super__Rb_tree_header) {
          *(undefined1 *)&iVar4._M_node[1]._M_parent = 1;
        }
      }
      ptVar8 = (t_object *)
               (ptVar7->v_privates).
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ptVar1 = (t_object *)
               (ptVar7->v_privates).
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = (ptVar7->v_privates).
                 super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (ptVar7->v_privates).
      super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (ptVar7->v_privates).
      super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (ptVar7->v_privates).
      super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (ptVar7->v_self_shared != false) {
        ptVar7->v_shareds = ptVar7->v_shareds + 1;
      }
      symbol = ptVar8;
      local_40._M_p = (pointer)ptVar1;
      for (; ptVar8 != ptVar1; ptVar8 = (t_object *)&ptVar8->v_previous) {
        p = (t_variable *)ptVar8->v_next;
        ptVar7 = this->v_scope;
        if (*(bool *)&((t_object *)p)->v_next == true) {
          ptVar2 = (t_object *)ptVar7->v_shareds;
          ptVar7->v_shareds = (size_t)((long)&ptVar2->v_next + 1);
          ((t_object *)p)->v_previous = ptVar2;
        }
        else {
          ((t_object *)p)->v_previous =
               (t_object *)
               ((long)(ptVar7->v_privates).
                      super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(ptVar7->v_privates).
                      super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
          std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
          push_back(&ptVar7->v_privates,&p);
        }
      }
      std::_Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
      ::~_Vector_base((_Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                       *)&symbol);
      return;
    }
    f_expression((t_parser *)&symbol);
    std::
    vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
    ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
              ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                *)&ptVar7->v_block,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)&symbol
              );
    if (symbol != (t_object *)0x0) {
      (*(code *)symbol->v_next->v_previous)();
    }
    if ((this->v_lexer).v_newline == false) break;
    if ((long)(this->v_lexer).v_indent.v_i + (-0x50 - (long)(this->v_lexer).v_indent.v_p) !=
        (long)pwVar6 + (-0x50 - (long)ptVar8)) {
      pwVar6 = L"unexpected indent.";
LAB_00178af1:
      a_message._M_str = pwVar6;
      a_message._M_len = 0x12;
      f_throw(this,a_message);
    }
  }
  pwVar6 = L"expecting newline.";
  goto LAB_00178af1;
}

Assistant:

void t_parser::operator()(ast::t_scope& a_scope)
{
	v_scope = &a_scope;
	size_t indent = v_lexer.f_indent();
	while (v_lexer.f_token() != t_lexer::c_token__EOF) {
		v_scope->v_block.push_back(f_expression());
		if (!v_lexer.f_newline()) f_throw(L"expecting newline."sv);
		if (v_lexer.f_indent() != indent) f_throw(L"unexpected indent."sv);
	}
	for (auto symbol : v_scope->v_unresolveds) {
		auto i = v_scope->v_variables.find(symbol);
		if (i != v_scope->v_variables.end()) i->second.v_shared = true;
	}
	std::vector<t_code::t_variable*> variables;
	variables.swap(v_scope->v_privates);
	if (v_scope->v_self_shared) ++v_scope->v_shareds;
	for (auto p : variables) {
		if (p->v_shared) {
			p->v_index = v_scope->v_shareds++;
		} else {
			p->v_index = v_scope->v_privates.size();
			v_scope->v_privates.push_back(p);
		}
	}
}